

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<JointPolicyDiscretePure>::reset(shared_ptr<JointPolicyDiscretePure> *this)

{
  shared_ptr<JointPolicyDiscretePure> *in_RDI;
  shared_ptr<JointPolicyDiscretePure> *in_stack_ffffffffffffffd8;
  
  shared_ptr((shared_ptr<JointPolicyDiscretePure> *)0x136a4d);
  swap(in_RDI,in_stack_ffffffffffffffd8);
  ~shared_ptr((shared_ptr<JointPolicyDiscretePure> *)0x136a66);
  return;
}

Assistant:

void reset() BOOST_NOEXCEPT // never throws in 1.30+
    {
        this_type().swap(*this);
    }